

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void check_morale(tgestate_t *state)

{
  if (state->morale < 2) {
    queue_message(state,message_MORALE_IS_ZERO);
    state->morale_exhausted = 0xff;
    state->automatic_player_counter = '\0';
  }
  return;
}

Assistant:

void check_morale(tgestate_t *state)
{
  assert(state != NULL);

  if (state->morale >= 2)
    return;

  queue_message(state, message_MORALE_IS_ZERO);

  /* Inhibit user input. */
  state->morale_exhausted = 255;

  /* Immediately assume automatic control of hero. */
  state->automatic_player_counter = 0;
}